

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O0

void s2shapeutil::AppendShapeEdges
               (S2ShapeIndex *index,S2ShapeIndexCell *cell,ShapeEdgeVector *shape_edges)

{
  S2Shape *shape_00;
  InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_> *this;
  S2ShapeIndexCell *pSVar1;
  int iVar2;
  int iVar3;
  ShapeEdge local_78;
  int local_40;
  int local_3c;
  int i;
  int num_edges;
  S2Shape *shape;
  S2ClippedShape *clipped;
  ShapeEdgeVector *pSStack_20;
  int s;
  ShapeEdgeVector *shape_edges_local;
  S2ShapeIndexCell *cell_local;
  S2ShapeIndex *index_local;
  
  clipped._4_4_ = 0;
  pSStack_20 = shape_edges;
  shape_edges_local = (ShapeEdgeVector *)cell;
  cell_local = (S2ShapeIndexCell *)index;
  while( true ) {
    iVar3 = clipped._4_4_;
    iVar2 = S2ShapeIndexCell::num_clipped((S2ShapeIndexCell *)shape_edges_local);
    if (iVar2 <= iVar3) break;
    shape = (S2Shape *)
            S2ShapeIndexCell::clipped((S2ShapeIndexCell *)shape_edges_local,clipped._4_4_);
    pSVar1 = cell_local;
    iVar3 = S2ClippedShape::shape_id((S2ClippedShape *)shape);
    _i = (S2Shape *)
         (**(code **)(*(long *)&(pSVar1->shapes_).
                                super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                     + 0x18))(pSVar1,iVar3);
    local_3c = S2ClippedShape::num_edges((S2ClippedShape *)shape);
    for (local_40 = 0; this = pSStack_20, shape_00 = _i, local_40 < local_3c;
        local_40 = local_40 + 1) {
      iVar3 = S2ClippedShape::edge((S2ClippedShape *)shape,local_40);
      ShapeEdge::ShapeEdge(&local_78,shape_00,iVar3);
      absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
      push_back(this,&local_78);
    }
    clipped._4_4_ = clipped._4_4_ + 1;
  }
  return;
}

Assistant:

static void AppendShapeEdges(const S2ShapeIndex& index,
                             const S2ShapeIndexCell& cell,
                             ShapeEdgeVector* shape_edges) {
  for (int s = 0; s < cell.num_clipped(); ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    const S2Shape& shape = *index.shape(clipped.shape_id());
    int num_edges = clipped.num_edges();
    for (int i = 0; i < num_edges; ++i) {
      shape_edges->push_back(ShapeEdge(shape, clipped.edge(i)));
    }
  }
}